

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void sbox_s128_full(mzd_local_t *in,mzd_local_t *mask_a,mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  word128 t0 [2];
  __m128i carry_1;
  __m128i total_carry_1;
  __m128i carry;
  __m128i total_carry;
  word128 x2m [2];
  word128 x1m [2];
  word128 x0m [2];
  word128 inm [2];
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  ulong local_9a8;
  ulong uStack_9a0;
  undefined1 local_998 [16];
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined8 local_938;
  undefined8 uStack_930;
  __m128i carry_3;
  __m128i total_carry_3;
  __m128i carry_2;
  __m128i total_carry_2;
  word128 t2 [2];
  word128 t1 [2];
  
  auVar8 = vpand_avx(*in_RDI,*in_RSI);
  auVar1._8_8_ = uStack_930;
  auVar1._0_8_ = local_938;
  auVar1 = vpand_avx(auVar1,local_958);
  auVar9 = vpand_avx(*in_RDI,*in_RDX);
  auVar2 = vpand_avx(in_RDI[1],in_RDX[1]);
  auVar3 = vpand_avx(*in_RDI,*in_RCX);
  auVar4 = vpand_avx(in_RDI[1],local_998);
  auVar6 = vpsrldq_avx(auVar8,8);
  auVar6 = vpsrlq_avx(auVar6,ZEXT416(0x3e));
  auVar7 = vpslldq_avx(auVar8,8);
  auVar7 = vpsrlq_avx(auVar7,ZEXT416(0x3e));
  auVar8 = vpsllq_avx(auVar8,ZEXT416(2));
  local_968 = vpor_avx(auVar8,auVar7);
  auVar8 = vpslldq_avx(auVar1,8);
  auVar7 = vpsrlq_avx(auVar8,ZEXT416(0x3e));
  auVar8 = vpsllq_avx(auVar1,ZEXT416(2));
  auVar8 = vpor_avx(auVar8,auVar7);
  vpor_avx(auVar8,auVar6);
  auVar8 = vpsrldq_avx(auVar9,8);
  auVar7 = vpsrlq_avx(auVar8,ZEXT416(0x3f));
  auVar8 = vpslldq_avx(auVar9,8);
  auVar6 = vpsrlq_avx(auVar8,ZEXT416(0x3f));
  auVar8 = vpsllq_avx(auVar9,ZEXT416(1));
  auVar6 = vpor_avx(auVar8,auVar6);
  auVar8 = vpslldq_avx(auVar2,8);
  auVar9 = vpsrlq_avx(auVar8,ZEXT416(0x3f));
  auVar8 = vpsllq_avx(auVar2,ZEXT416(1));
  auVar8 = vpor_avx(auVar8,auVar9);
  vpor_avx(auVar8,auVar7);
  local_a08 = vpand_avx(auVar6,auVar3);
  local_9f8 = vpand_avx(auVar2,auVar4);
  local_a28 = vpand_avx(local_968,auVar3);
  local_a18 = vpand_avx(auVar1,auVar4);
  auVar8 = vpand_avx(local_968,auVar6);
  auVar9 = vpand_avx(auVar1,auVar2);
  uVar5 = local_a08._8_8_ ^ local_968._8_8_;
  local_a08._0_8_ = local_a08._0_8_ ^ local_968._0_8_;
  local_a08._8_8_ = uVar5;
  local_958._0_8_ = auVar1._0_8_;
  local_958._8_8_ = auVar1._8_8_;
  uVar5 = local_9f8._8_8_ ^ local_958._8_8_;
  local_9f8._0_8_ = local_9f8._0_8_ ^ local_958._0_8_;
  local_9f8._8_8_ = uVar5;
  local_988 = auVar6._0_8_;
  uStack_980 = auVar6._8_8_;
  uStack_980 = local_968._8_8_ ^ uStack_980;
  local_968._0_8_ = local_968._0_8_ ^ local_988;
  local_968._8_8_ = uStack_980;
  local_978 = auVar2._0_8_;
  uStack_970 = auVar2._8_8_;
  local_968._0_8_ = SUB168(local_968,0);
  local_968._8_8_ = SUB168(local_968,8);
  uVar5 = local_a28._8_8_ ^ local_968._8_8_;
  local_a28._0_8_ = local_a28._0_8_ ^ local_968._0_8_;
  local_a28._8_8_ = uVar5;
  uVar5 = local_a18._8_8_ ^ local_958._8_8_ ^ uStack_970;
  local_a18._0_8_ = local_a18._0_8_ ^ local_958._0_8_ ^ local_978;
  local_a18._8_8_ = uVar5;
  local_a48 = auVar8._0_8_;
  uStack_a40 = auVar8._8_8_;
  local_a38 = auVar9._0_8_;
  uStack_a30 = auVar9._8_8_;
  local_9a8 = auVar3._0_8_;
  uStack_9a0 = auVar3._8_8_;
  local_998._0_8_ = auVar4._0_8_;
  local_998._8_8_ = auVar4._8_8_;
  auVar8 = vpslldq_avx(local_9f8,8);
  auVar1 = vpsllq_avx(auVar8,ZEXT416(0x3e));
  auVar8 = vpsrldq_avx(local_a08,8);
  auVar8 = vpsllq_avx(auVar8,ZEXT416(0x3e));
  auVar9 = vpsrlq_avx(local_a08,ZEXT416(2));
  auVar8 = vpor_avx(auVar9,auVar8);
  auVar9 = vpsrldq_avx(local_9f8,8);
  auVar9 = vpsllq_avx(auVar9,ZEXT416(0x3e));
  auVar2 = vpsrlq_avx(local_9f8,ZEXT416(2));
  vpor_avx(auVar2,auVar9);
  local_a08 = vpor_avx(auVar8,auVar1);
  auVar8 = vpslldq_avx(local_a18,8);
  auVar1 = vpsllq_avx(auVar8,ZEXT416(0x3f));
  auVar8 = vpsrldq_avx(local_a28,8);
  auVar8 = vpsllq_avx(auVar8,ZEXT416(0x3f));
  auVar9 = vpsrlq_avx(local_a28,ZEXT416(1));
  auVar8 = vpor_avx(auVar9,auVar8);
  auVar9 = vpsrldq_avx(local_a18,8);
  auVar9 = vpsllq_avx(auVar9,ZEXT416(0x3f));
  auVar2 = vpsrlq_avx(local_a18,ZEXT416(1));
  vpor_avx(auVar2,auVar9);
  auVar8 = vpor_avx(auVar8,auVar1);
  local_a28._0_8_ = auVar8._0_8_;
  local_a28._8_8_ = auVar8._8_8_;
  uVar5 = local_a08._8_8_ ^ local_a28._8_8_;
  local_a08._0_8_ = local_a08._0_8_ ^ local_a28._0_8_;
  local_a08._8_8_ = uVar5;
  local_a08._0_8_ = SUB168(local_a08,0);
  local_a08._8_8_ = SUB168(local_a08,8);
  *(ulong *)*in_RDI = local_a08._0_8_ ^ local_a48 ^ local_968._0_8_ ^ local_9a8;
  *(ulong *)(*in_RDI + 8) = local_a08._8_8_ ^ uStack_a40 ^ local_968._8_8_ ^ uStack_9a0;
  *(ulong *)in_RDI[1] =
       local_9f8._0_8_ ^ local_a18._0_8_ ^ local_a38 ^ local_958._0_8_ ^ local_978 ^ local_998._0_8_
  ;
  *(ulong *)(in_RDI[1] + 8) =
       local_9f8._8_8_ ^ local_a18._8_8_ ^
       uStack_a30 ^ local_958._8_8_ ^ uStack_970 ^ local_998._8_8_;
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void sbox_s128_full(mzd_local_t* in, const mzd_local_t* mask_a,
                                  const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  word128 inm[2] = {mm128_load(&in->w64[0]), mm128_load(&in->w64[2])};
  word128 x0m[2] = {mm128_load(&mask_a->w64[0]), mm128_load(&mask_a->w64[2])};
  word128 x1m[2] = {mm128_load(&mask_b->w64[0]), mm128_load(&mask_b->w64[2])};
  word128 x2m[2] = {mm128_load(&mask_c->w64[0]), mm128_load(&mask_c->w64[2])};
  mm128_and_256(x0m, inm, x0m);
  mm128_and_256(x1m, inm, x1m);
  mm128_and_256(x2m, inm, x2m);

  mm128_shift_left_256(x0m, x0m, 2);
  mm128_shift_left_256(x1m, x1m, 1);

  word128 t0[2], t1[2], t2[2];
  mm128_and_256(t0, x1m, x2m);
  mm128_and_256(t1, x0m, x2m);
  mm128_and_256(t2, x0m, x1m);

  mm128_xor_256(t0, t0, x0m);

  mm128_xor_256(x0m, x0m, x1m);
  mm128_xor_256(t1, t1, x0m);

  mm128_xor_256(t2, t2, x0m);
  mm128_xor_256(t2, t2, x2m);

  mm128_shift_right_256(t0, t0, 2);
  mm128_shift_right_256(t1, t1, 1);

  mm128_xor_256(t0, t0, t1);
  mm128_xor_256(inm, t0, t2);
  mm128_store(&in->w64[0], inm[0]);
  mm128_store(&in->w64[2], inm[1]);
}